

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatTest_UdlTemplate_Test::TestBody(FormatTest_UdlTemplate_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  char *pcVar4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  char (*in_stack_fffffffffffffe78) [11];
  wstring *expected;
  char *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  int line;
  int *in_stack_fffffffffffffe90;
  string *file;
  udl_formatter<char,____,__0_,__:_,__1_,__0_,____> *in_stack_fffffffffffffe98;
  Type type;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  str *format_str;
  anon_class_1_0_00000001 local_122 [2];
  wstring local_120 [8];
  Message *in_stack_fffffffffffffee8;
  AssertHelper *in_stack_fffffffffffffef0;
  AssertionResult local_100 [2];
  undefined4 local_e0;
  anon_class_1_0_00000001 local_da [2];
  string local_d8 [32];
  AssertionResult local_b8 [2];
  undefined4 local_98;
  str local_90 [32];
  AssertionResult local_70 [3];
  string local_38 [32];
  AssertionResult local_18;
  
  fmt::v5::literals::operator___format<char,__f_,__o_,__o_>();
  fmt::v5::internal::udl_formatter<char,_'f',_'o',_'o'>::operator()<>
            ((udl_formatter<char,__f_,__o_,__o_> *)in_stack_fffffffffffffe98);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             in_stack_fffffffffffffe80,(char (*) [4])in_stack_fffffffffffffe78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    testing::AssertionResult::failure_message((AssertionResult *)0x17d941);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
               (Type)((ulong)in_stack_fffffffffffffe98 >> 0x20),(char *)in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    testing::Message::~Message((Message *)0x17d99e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17d9f6);
  fmt::v5::literals::operator___format<char,____,__0_,__:_,__1_,__0_,____>();
  local_98 = 0x2a;
  format_str = local_90;
  fmt::v5::internal::udl_formatter<char,(char)123,(char)48,(char)58,(char)49,(char)48,(char)125>::
  operator()(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  type = (Type)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  std::__cxx11::string::~string((string *)local_90);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_70);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffffea0));
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x17daed);
    type = (Type)((ulong)pcVar4 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffea0),type,
               (char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80
              );
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    testing::Message::~Message((Message *)0x17db4a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17dba2);
  TestBody::anon_class_1_0_00000001::operator()(local_da);
  local_e0 = 0x2a;
  file = local_d8;
  fmt::v5::operator()(format_str,(int *)CONCAT17(uVar2,in_stack_fffffffffffffea0));
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             in_stack_fffffffffffffe80,(char (*) [3])in_stack_fffffffffffffe78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  std::__cxx11::string::~string(local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b8);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe8c);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffffea0));
    in_stack_fffffffffffffe80 =
         testing::AssertionResult::failure_message((AssertionResult *)0x17dca1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffea0),type,(char *)file,line,
               in_stack_fffffffffffffe80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    testing::Message::~Message((Message *)0x17dcfe);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17dd56);
  TestBody::anon_class_1_0_00000001::operator()(local_122);
  expected = local_120;
  fmt::v5::operator()(format_str,(int *)CONCAT17(uVar2,in_stack_fffffffffffffea0));
  testing::internal::EqHelper<false>::Compare<wchar_t[3],std::__cxx11::wstring>
            ((char *)CONCAT44(line,in_stack_fffffffffffffe88),in_stack_fffffffffffffe80,
             (wchar_t (*) [3])expected,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  std::__cxx11::wstring::~wstring(local_120);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(local_100);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffffea0));
    testing::AssertionResult::failure_message((AssertionResult *)0x17de3d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffea0),type,(char *)file,line,
               in_stack_fffffffffffffe80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffe70));
    testing::Message::~Message((Message *)0x17de89);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17ded8);
  return;
}

Assistant:

TEST(FormatTest, UdlTemplate) {
  EXPECT_EQ("foo", "foo"_format());
  EXPECT_EQ("        42", "{0:10}"_format(42));
  EXPECT_EQ("42", fmt::format(FMT_STRING("{}"), 42));
  EXPECT_EQ(L"42", fmt::format(FMT_STRING(L"{}"), 42));
}